

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

Float __thiscall pbrt::sRGBColorEncoding::ToFloatLinear(sRGBColorEncoding *this,Float v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = v;
  if (0.04045 < v) {
    auVar3 = auVar4._0_16_;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc2102ed3),0),auVar3,ZEXT416(0xc23dde7b));
    auVar1 = vfmadd213ss_fma(auVar1,auVar3,ZEXT416(0xc1333068));
    auVar1 = vfmadd213ss_fma(auVar1,auVar3,ZEXT416(0xbf3d170a));
    auVar1 = vfmadd213ss_fma(auVar1,auVar3,ZEXT416(0xbc864b4d));
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)(v + -18.225746)),auVar3,ZEXT416(0xc26c62b8));
    auVar2 = vfmadd213ss_fma(auVar2,auVar3,ZEXT416(0xc199209d));
    auVar2 = vfmadd213ss_fma(auVar2,auVar3,ZEXT416(0xbb8ba3e4));
    return (auVar1._0_4_ / auVar2._0_4_) * v;
  }
  return v * 0.07739938;
}

Assistant:

Float sRGBColorEncoding::ToFloatLinear(Float v) const {
    return SRGBToLinear(v);
}